

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_extp_mips(target_ulong_conflict ac,target_ulong_conflict size,CPUMIPSState_conflict *env)

{
  char cVar1;
  uint32_t uVar2;
  uint64_t acc;
  uint32_t temp;
  int sub;
  int32_t start_pos;
  CPUMIPSState_conflict *env_local;
  target_ulong_conflict size_local;
  target_ulong_conflict ac_local;
  
  acc._4_4_ = 0;
  uVar2 = get_DSPControl_pos(env);
  if ((int)(uVar2 - ((size & 0x1f) + 1)) < -1) {
    set_DSPControl_efi(1,env);
  }
  else {
    cVar1 = (char)(size & 0x1f);
    acc._4_4_ = (uint)(CONCAT44((env->active_tc).HI[ac],(env->active_tc).LO[ac]) >>
                      ((char)uVar2 - cVar1 & 0x3fU)) & 0xffffffffU >> (0x1fU - cVar1 & 0x1f);
    set_DSPControl_efi(0,env);
  }
  return acc._4_4_;
}

Assistant:

target_ulong helper_extp(target_ulong ac, target_ulong size, CPUMIPSState *env)
{
    int32_t start_pos;
    int sub;
    uint32_t temp;
    uint64_t acc;

    size = size & 0x1F;

    temp = 0;
    start_pos = get_DSPControl_pos(env);
    sub = start_pos - (size + 1);
    if (sub >= -1) {
        acc = ((uint64_t)env->active_tc.HI[ac] << 32) |
              ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);
        temp = (acc >> (start_pos - size)) & (~0U >> (31 - size));
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return (target_ulong)temp;
}